

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O2

int test_auth_password(LIBSSH2_SESSION *session,int flags,char *username,char *password)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sStack_40;
  
  sVar2 = strlen(username);
  pcVar3 = (char *)libssh2_userauth_list(session,username,sVar2 & 0xffffffff);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "libssh2_userauth_list";
LAB_00102c10:
    print_last_session_error(pcVar3);
  }
  else {
    pcVar4 = strstr(pcVar3,"password");
    if (pcVar4 == (char *)0x0) {
      fprintf(_stderr,"\'password\' was expected in userauth list: %s\n",pcVar3);
      return 1;
    }
    sVar2 = strlen(username);
    sVar5 = strlen(password);
    iVar1 = libssh2_userauth_password_ex
                      (session,username,sVar2 & 0xffffffff,password,sVar5 & 0xffffffff,0);
    if ((flags & 1U) == 0) {
      if (iVar1 != 0) {
        pcVar3 = "libssh2_userauth_password_ex";
        goto LAB_00102c10;
      }
      iVar1 = libssh2_userauth_authenticated(session);
      if (iVar1 != 0) {
        return 0;
      }
      pcVar3 = "Password auth appeared to succeed but libssh2_userauth_authenticated returned 0\n";
      sStack_40 = 0x50;
    }
    else {
      if (iVar1 != 0) {
        return 0;
      }
      pcVar3 = "Password auth succeeded with wrong password\n";
      sStack_40 = 0x2c;
    }
    fwrite(pcVar3,sStack_40,1,_stderr);
  }
  return 1;
}

Assistant:

int test_auth_password(LIBSSH2_SESSION *session, int flags,
                       const char *username,
                       const char *password)
{
    int rc;

    const char *userauth_list =
        libssh2_userauth_list(session, username,
                              (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "password")) {
        fprintf(stderr, "'password' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_password_ex(session, username,
                                      (unsigned int)strlen(username),
                                      password,
                                      (unsigned int)strlen(password),
                                      NULL);

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Password auth succeeded with wrong password\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error("libssh2_userauth_password_ex");
            return 1;
        }

        if(libssh2_userauth_authenticated(session) == 0) {
            fprintf(stderr, "Password auth appeared to succeed but "
                            "libssh2_userauth_authenticated returned 0\n");
            return 1;
        }
    }

    return 0;
}